

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O2

bool ASDCP::ATMOS::IsDolbyAtmos(string *filename)

{
  int iVar1;
  allocator<char> local_49;
  string local_48 [32];
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_28,"atmos",&local_49);
  Kumu::PathGetExtension(local_48);
  iVar1 = std::__cxx11::string::compare(local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return iVar1 == 0;
}

Assistant:

bool
ASDCP::ATMOS::IsDolbyAtmos(const std::string& filename)
{
    // TODO
    // For now use an atmos extension
    bool result = ( 0 == (std::string("atmos").compare(Kumu::PathGetExtension(filename))) );
    return result;
}